

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Iterator::Prev(Iterator *this)

{
  Node *pNVar1;
  long *in_RDI;
  char **in_stack_00000008;
  
  pNVar1 = FindLessThan((SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *)this,
                        in_stack_00000008);
  in_RDI[1] = (long)pNVar1;
  if (in_RDI[1] == *(long *)(*in_RDI + 0x18)) {
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

inline void SkipList<Key, Comparator>::Iterator::Prev() {
  // Instead of using explicit "prev" links, we just search for the
  // last node that falls before key.
  assert(Valid());
  node_ = list_->FindLessThan(node_->key);
  if (node_ == list_->head_) {
    node_ = nullptr;
  }
}